

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

void do_start_gesture_proc(Am_Object param_1)

{
  Am_Value *pAVar1;
  char cVar2;
  Am_String local_10;
  
  Am_Object::Set(0x538,0x169,0);
  pAVar1 = (Am_Value *)Am_Object::Get(0x568,0x169);
  Am_String::Am_String(&local_10,pAVar1);
  cVar2 = Am_String::operator==(&local_10,&training_mode);
  Am_String::~Am_String(&local_10);
  if (cVar2 == '\0') {
    Am_Object::Set(0x518,0x169,0);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_start_gesture, (Am_Object /*cmd*/))
{
  example_panel.Set(Am_VALUE, 0);

  if (Am_String(mode.Get(Am_VALUE)) != training_mode)
    class_panel.Set(Am_VALUE, 0);
}